

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::InternReadFile
          (Discreet3DSImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  float *this_00;
  bool bVar1;
  uint uVar2;
  IOStream *stream_00;
  DeadlyImportError *pDVar3;
  vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_> *this_01;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  reference local_260;
  Mesh *mesh;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_> *__range1;
  string local_238;
  undefined1 local_218 [8];
  Node _rootNode;
  Scene _scene;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  StreamReaderLE stream;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  Discreet3DSImporter *this_local;
  
  stream._48_8_ = pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"rb",&local_81);
  stream_00 = IOSystem::Open(pIOHandler,pFile,&local_80);
  StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_60,stream_00,false);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  uVar2 = StreamReader<false,_false>::GetRemainingSize((StreamReader<false,_false> *)local_60);
  if (uVar2 < 0x10) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b8,"3DS file is either empty or corrupt: ",pFile);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_b8);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this->stream = (StreamReaderLE *)local_60;
  this_00 = &_rootNode.vPivot.z;
  D3DS::Scene::Scene((Scene *)this_00);
  this->mScene = (Scene *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"UNNAMED",(allocator<char> *)((long)&__range1 + 7));
  D3DS::Node::Node((Node *)local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this->mLastNodeIndex = -1;
  this->mCurrentNode = (Node *)local_218;
  this->mRootNode = this->mCurrentNode;
  this->mRootNode->mHierarchyPos = -1;
  this->mRootNode->mHierarchyIndex = -1;
  this->mRootNode->mParent = (Node *)0x0;
  this->mMasterScale = 1.0;
  std::__cxx11::string::operator=((string *)&this->mBackgroundImage,"");
  this->bHasBG = false;
  this->bIsPrj = false;
  ParseMainChunk(this);
  this_01 = &this->mScene->mMeshes;
  __end1 = std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::begin(this_01);
  mesh = (Mesh *)std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                                *)&mesh);
    if (!bVar1) {
      ReplaceDefaultMaterial(this);
      ConvertScene(this,pScene);
      GenerateNodeGraph(this,pScene);
      ApplyMasterScale(this,pScene);
      this->mRootNode = (Node *)0x0;
      this->mScene = (Scene *)0x0;
      this->stream = (StreamReaderLE *)0x0;
      D3DS::Node::~Node((Node *)local_218);
      D3DS::Scene::~Scene((Scene *)&_rootNode.vPivot.z);
      StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_60);
      return;
    }
    local_260 = __gnu_cxx::
                __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                ::operator*(&__end1);
    sVar4 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::size
                      (&(local_260->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces);
    if (sVar4 != 0) {
      sVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_260
                        );
      if (sVar4 == 0) {
        pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_280,"3DS file contains faces but no vertices: ",pFile);
        DeadlyImportError::DeadlyImportError(pDVar3,&local_280);
        __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
    }
    CheckIndices(this,local_260);
    MakeUnique(this,local_260);
    ComputeNormalsWithSmoothingsGroups<Assimp::D3DS::Face>
              (&local_260->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>);
    __gnu_cxx::
    __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Discreet3DSImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile,"rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16) {
        throw DeadlyImportError("3DS file is either empty or corrupt: " + pFile);
    }
    this->stream = &stream;

    // Allocate our temporary 3DS representation
    D3DS::Scene _scene;
    mScene = &_scene;

    // Initialize members
    D3DS::Node _rootNode("UNNAMED");
    mLastNodeIndex             = -1;
    mCurrentNode               = &_rootNode;
    mRootNode                  = mCurrentNode;
    mRootNode->mHierarchyPos   = -1;
    mRootNode->mHierarchyIndex = -1;
    mRootNode->mParent         = NULL;
    mMasterScale               = 1.0f;
    mBackgroundImage           = "";
    bHasBG                     = false;
    bIsPrj                     = false;

    // Parse the file
    ParseMainChunk();

    // Process all meshes in the file. First check whether all
    // face indices have valid values. The generate our
    // internal verbose representation. Finally compute normal
    // vectors from the smoothing groups we read from the
    // file.
    for (auto &mesh : mScene->mMeshes) {
        if (mesh.mFaces.size() > 0 && mesh.mPositions.size() == 0)  {
            throw DeadlyImportError("3DS file contains faces but no vertices: " + pFile);
        }
        CheckIndices(mesh);
        MakeUnique  (mesh);
        ComputeNormalsWithSmoothingsGroups<D3DS::Face>(mesh);
    }

    // Replace all occurences of the default material with a
    // valid material. Generate it if no material containing
    // DEFAULT in its name has been found in the file
    ReplaceDefaultMaterial();

    // Convert the scene from our internal representation to an
    // aiScene object. This involves copying all meshes, lights
    // and cameras to the scene
    ConvertScene(pScene);

    // Generate the node graph for the scene. This is a little bit
    // tricky since we'll need to split some meshes into sub-meshes
    GenerateNodeGraph(pScene);

    // Now apply the master scaling factor to the scene
    ApplyMasterScale(pScene);

    // Our internal scene representation and the root
    // node will be automatically deleted, so the whole hierarchy will follow

    AI_DEBUG_INVALIDATE_PTR(mRootNode);
    AI_DEBUG_INVALIDATE_PTR(mScene);
    AI_DEBUG_INVALIDATE_PTR(this->stream);
}